

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Value::~Value(Value *this)

{
  releasePayload(this);
  (this->value_).int_ = 0;
  std::
  unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  ::~unique_ptr(&(this->comments_).ptr_);
  return;
}

Assistant:

Value::~Value() {
  releasePayload();
  value_.uint_ = 0;
}